

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void InitZopfliCostModel(MemoryManager *m,ZopfliCostModel *self,BrotliDistanceParams *dist,
                        size_t num_bytes)

{
  float *local_38;
  float *local_30;
  size_t num_bytes_local;
  BrotliDistanceParams *dist_local;
  ZopfliCostModel *self_local;
  MemoryManager *m_local;
  
  self->num_bytes_ = num_bytes;
  if (num_bytes == 0xfffffffffffffffe) {
    local_30 = (float *)0x0;
  }
  else {
    local_30 = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  self->literal_costs_ = local_30;
  if (dist->alphabet_size_limit == 0) {
    local_38 = (float *)0x0;
  }
  else {
    local_38 = (float *)BrotliAllocate(m,(ulong)dist->alphabet_size_limit << 2);
  }
  self->cost_dist_ = local_38;
  self->distance_histogram_size = dist->alphabet_size_limit;
  return;
}

Assistant:

static void InitZopfliCostModel(
    MemoryManager* m, ZopfliCostModel* self, const BrotliDistanceParams* dist,
    size_t num_bytes) {
  self->num_bytes_ = num_bytes;
  self->literal_costs_ = BROTLI_ALLOC(m, float, num_bytes + 2);
  self->cost_dist_ = BROTLI_ALLOC(m, float, dist->alphabet_size_limit);
  self->distance_histogram_size = dist->alphabet_size_limit;
  if (BROTLI_IS_OOM(m)) return;
}